

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

BGZF * bgzf_open(char *path,char *mode)

{
  ulong uVar1;
  char *pcVar2;
  hFILE *hfpr;
  BGZF *pBVar3;
  int *piVar4;
  
  uVar1 = compressBound(0xff00);
  if (0xffff < uVar1) {
    __assert_fail("compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                  ,0xac,"BGZF *bgzf_open(const char *, const char *)");
  }
  pcVar2 = strchr(mode,0x72);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strchr(mode,0x77);
    if ((pcVar2 == (char *)0x0) && (pcVar2 = strchr(mode,0x61), pcVar2 == (char *)0x0)) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
    }
    else {
      hfpr = hopen(path,mode);
      if (hfpr != (hFILE *)0x0) {
        pBVar3 = bgzf_write_init(mode);
        goto LAB_0013709f;
      }
    }
  }
  else {
    hfpr = hopen(path,mode);
    if (hfpr != (hFILE *)0x0) {
      pBVar3 = bgzf_read_init(hfpr);
      if (pBVar3 != (BGZF *)0x0) {
LAB_0013709f:
        pBVar3->fp = hfpr;
        pBVar3->field_0x2 = pBVar3->field_0x2 & 0xf3;
        return pBVar3;
      }
      hclose_abruptly(hfpr);
    }
  }
  return (BGZF *)0x0;
}

Assistant:

BGZF *bgzf_open(const char *path, const char *mode)
{
    BGZF *fp = 0;
    assert(compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE);
    if (strchr(mode, 'r')) {
        hFILE *fpr;
        if ((fpr = hopen(path, mode)) == 0) return 0;
        fp = bgzf_read_init(fpr);
        if (fp == 0) { hclose_abruptly(fpr); return NULL; }
        fp->fp = fpr;
    } else if (strchr(mode, 'w') || strchr(mode, 'a')) {
        hFILE *fpw;
        if ((fpw = hopen(path, mode)) == 0) return 0;
        fp = bgzf_write_init(mode);
        fp->fp = fpw;
    }
    else { errno = EINVAL; return 0; }

    fp->is_be = ed_is_big();
    return fp;
}